

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  undefined1 uVar1;
  void *p;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t sVar9;
  size_t __n;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint32_t histogram [272];
  uint8_t depths [272];
  uint16_t bits [272];
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    p = BrotliAllocate(m,context_map_size * 4);
    uVar10 = *context_map;
    if (1 < context_map_size) {
      sVar2 = 1;
      do {
        if (uVar10 < context_map[sVar2]) {
          uVar10 = context_map[sVar2];
        }
        sVar2 = sVar2 + 1;
      } while (context_map_size != sVar2);
    }
    lVar5 = 0;
    do {
      *(char *)((long)histogram + lVar5) = (char)lVar5;
      lVar5 = lVar5 + 1;
    } while ((ulong)uVar10 + 1 != lVar5);
    if (context_map_size == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = uVar10 + 1;
      sVar2 = 0;
      do {
        if (uVar10 == 0) {
          __n = 0;
        }
        else {
          sVar9 = 0;
          do {
            __n = sVar9;
            if (*(char *)((long)histogram + sVar9) == (char)context_map[sVar2]) break;
            sVar9 = sVar9 + 1;
            __n = (ulong)uVar10;
          } while (uVar10 != sVar9);
        }
        *(int *)((long)p + sVar2 * 4) = (int)__n;
        uVar1 = *(undefined1 *)((long)histogram + __n);
        if (__n != 0) {
          memmove((void *)((long)histogram + 1),histogram,__n);
        }
        histogram[0]._0_1_ = uVar1;
        sVar2 = sVar2 + 1;
      } while (sVar2 != context_map_size);
      uVar10 = 0;
      uVar6 = 0;
      do {
        uVar12 = uVar6 + 1;
        if (uVar6 + 1 < context_map_size) {
          uVar12 = context_map_size;
        }
        do {
          uVar7 = uVar6;
          if (*(int *)((long)p + uVar6 * 4) == 0) break;
          uVar6 = uVar6 + 1;
          uVar7 = uVar12;
        } while (uVar12 != uVar6);
        uVar6 = uVar7;
        uVar11 = 0;
        if (uVar7 < context_map_size) {
          iVar4 = (int)uVar7;
          uVar8 = 0;
          do {
            uVar6 = uVar7;
            uVar11 = uVar8;
            if (*(int *)((long)p + uVar7 * 4) != 0) break;
            uVar8 = uVar8 + 1;
            uVar7 = uVar7 + 1;
            uVar6 = context_map_size;
            uVar11 = (int)context_map_size - iVar4;
          } while (context_map_size != uVar7);
        }
        if (uVar10 < uVar11) {
          uVar10 = uVar11;
        }
      } while (uVar6 < context_map_size);
    }
    uVar11 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar8 = 6;
    if (uVar11 < 6) {
      uVar8 = uVar11;
    }
    if (uVar10 == 0) {
      uVar8 = 0;
    }
    if (context_map_size == 0) {
      lVar5 = 0;
    }
    else {
      uVar10 = 2 << ((byte)uVar8 & 0x1f);
      lVar5 = 0;
      uVar6 = 0;
      do {
        iVar4 = *(int *)((long)p + uVar6 * 4);
        if (iVar4 == 0) {
          uVar12 = 1;
          if (uVar6 + 1 < context_map_size) {
            uVar12 = (ulong)(uint)((int)context_map_size - (int)uVar6);
            uVar7 = 1;
            do {
              if (*(int *)((long)p + uVar7 * 4 + uVar6 * 4) != 0) {
                uVar12 = uVar7 & 0xffffffff;
                break;
              }
              uVar7 = uVar7 + 1;
            } while (context_map_size - uVar6 != uVar7);
          }
          uVar7 = uVar12;
          if ((int)uVar12 != 0) {
LAB_001142ee:
            uVar11 = (uint)uVar7;
            if (uVar10 <= uVar11) goto code_r0x001142f2;
            uVar13 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            uVar13 = ((-1 << ((byte)uVar13 & 0x1f)) + uVar11) * 0x200 | uVar13;
            goto LAB_0011429b;
          }
        }
        else {
          uVar13 = iVar4 + uVar8;
          uVar12 = 1;
LAB_0011429b:
          *(uint *)((long)p + lVar5 * 4) = uVar13;
          lVar5 = lVar5 + 1;
        }
LAB_001142a2:
        uVar6 = uVar6 + uVar12;
      } while (uVar6 < context_map_size);
    }
    memset(histogram,0,0x440);
    if (lVar5 != 0) {
      lVar3 = 0;
      do {
        histogram[*(uint *)((long)p + lVar3 * 4) & 0x1ff] =
             histogram[*(uint *)((long)p + lVar3 * 4) & 0x1ff] + 1;
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
    }
    uVar12 = *storage_ix;
    uVar6 = uVar12 + 1;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)(uVar8 != 0) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    *storage_ix = uVar6;
    if (uVar8 != 0) {
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)(uVar8 - 1) << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar12 + 5;
    }
    BuildAndStoreHuffmanTree
              (histogram,uVar8 + num_clusters,uVar8 + num_clusters,tree,depths,bits,storage_ix,
               storage);
    if (lVar5 != 0) {
      lVar3 = 0;
      do {
        uVar10 = *(uint *)((long)p + lVar3 * 4);
        uVar11 = uVar10 & 0x1ff;
        uVar12 = (ulong)uVar11;
        uVar6 = *storage_ix;
        uVar7 = depths[uVar12] + uVar6;
        *(ulong *)(storage + (uVar6 >> 3)) =
             (ulong)bits[uVar12] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
        *storage_ix = uVar7;
        if (uVar11 - 1 < uVar8) {
          *(ulong *)(storage + (uVar7 >> 3)) =
               (ulong)(uVar10 >> 9) << ((byte)uVar7 & 7) | (ulong)storage[uVar7 >> 3];
          *storage_ix = uVar12 + uVar7;
        }
        lVar3 = lVar3 + 1;
      } while (lVar5 != lVar3);
    }
    uVar6 = *storage_ix;
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    *storage_ix = uVar6 + 1;
    BrotliFree(m,p);
  }
  return;
code_r0x001142f2:
  *(uint *)((long)p + lVar5 * 4) = ~(-1 << ((byte)uVar8 & 0x1f)) * 0x200 + uVar8;
  lVar5 = lVar5 + 1;
  uVar11 = (uVar11 - uVar10) + 1;
  uVar7 = (ulong)uVar11;
  if (uVar11 == 0) goto LAB_001142a2;
  goto LAB_001142ee;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}